

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanObjectWrappers.hpp
# Opt level: O0

VulkanObjectWrapper<VkQueryPool_T_*,_(VulkanUtilities::VulkanHandleTypeId)20> * __thiscall
VulkanUtilities::VulkanObjectWrapper<VkQueryPool_T_*,_(VulkanUtilities::VulkanHandleTypeId)20>::
operator=(VulkanObjectWrapper<VkQueryPool_T_*,_(VulkanUtilities::VulkanHandleTypeId)20> *this,
         VulkanObjectWrapper<VkQueryPool_T_*,_(VulkanUtilities::VulkanHandleTypeId)20> *rhs)

{
  VulkanObjectWrapper<VkQueryPool_T_*,_(VulkanUtilities::VulkanHandleTypeId)20> *rhs_local;
  VulkanObjectWrapper<VkQueryPool_T_*,_(VulkanUtilities::VulkanHandleTypeId)20> *this_local;
  
  Release(this);
  std::shared_ptr<const_VulkanUtilities::VulkanLogicalDevice>::operator=
            (&this->m_pLogicalDevice,&rhs->m_pLogicalDevice);
  this->m_VkObject = rhs->m_VkObject;
  rhs->m_VkObject = (VkQueryPool_T *)0x0;
  return this;
}

Assistant:

VulkanObjectWrapper& operator=(VulkanObjectWrapper&& rhs) noexcept
    {
        Release();
        m_pLogicalDevice = std::move(rhs.m_pLogicalDevice);
        m_VkObject       = rhs.m_VkObject;
        rhs.m_VkObject   = VK_NULL_HANDLE;
        return *this;
    }